

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UChar32 utext_previous32_63(UText *ut)

{
  UChar UVar1;
  int iVar2;
  UBool UVar3;
  uint uVar4;
  
  if ((ut->chunkOffset < 1) &&
     (UVar3 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0'), UVar3 == '\0')) {
    return -1;
  }
  iVar2 = ut->chunkOffset;
  ut->chunkOffset = iVar2 + -1;
  UVar1 = ut->chunkContents[(long)iVar2 + -1];
  uVar4 = (uint)(ushort)UVar1;
  if ((uVar4 & 0xfc00) == 0xdc00) {
    if ((iVar2 < 2) && (UVar3 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0'), UVar3 == '\0'))
    {
      return uVar4;
    }
    if ((ut->chunkContents[(long)ut->chunkOffset + -1] & 0xfc00U) == 0xd800) {
      uVar4 = (uint)(ushort)UVar1 +
              (uint)(ushort)ut->chunkContents[(long)ut->chunkOffset + -1] * 0x400 + 0xfca02400;
      ut->chunkOffset = ut->chunkOffset + -1;
    }
  }
  return uVar4;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_previous32(UText *ut) {
    UChar32       c;

    if (ut->chunkOffset <= 0) {
        if (ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE) == FALSE) {
            return U_SENTINEL;
        }
    }
    ut->chunkOffset--;
    c = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_TRAIL(c) == FALSE) {
        // Normal case, not supplementary.
        //   (A lead surrogate seen here is just returned as is, as a surrogate value.
        //    It cannot be part of a pair.)
        return c;
    }

    if (ut->chunkOffset <= 0) {
        if (ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE) == FALSE) {
            // c is an unpaired trail surrogate at the start of the text.
            // return it as it is.
            return c;
        }
    }

    UChar32 lead = ut->chunkContents[ut->chunkOffset-1];
    if (U16_IS_LEAD(lead) == FALSE) {
        // c was an unpaired trail surrogate, not at the end of the text.
        // return it as it is (unpaired).  Iteration position is at c
        return c;
    }

    UChar32 supplementary = U16_GET_SUPPLEMENTARY(lead, c);
    ut->chunkOffset--;   // move iteration position over the lead surrogate.
    return supplementary;
}